

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcFlowStorageDevice::IfcFlowStorageDevice(IfcFlowStorageDevice *this)

{
  *(undefined ***)&(this->super_IfcDistributionFlowElement).field_0x168 = &PTR__Object_007631c0;
  *(undefined8 *)&this->field_0x170 = 0;
  *(char **)&this->field_0x178 = "IfcFlowStorageDevice";
  IfcDistributionFlowElement::IfcDistributionFlowElement
            (&this->super_IfcDistributionFlowElement,&PTR_construction_vtable_24__0077c6d0);
  *(undefined8 *)
   &(this->super_IfcDistributionFlowElement).super_IfcDistributionElement.super_IfcElement.
    super_IfcProduct.super_IfcObject = 0x77c578;
  *(undefined8 *)&(this->super_IfcDistributionFlowElement).field_0x168 = 0x77c6b8;
  *(undefined8 *)
   &(this->super_IfcDistributionFlowElement).super_IfcDistributionElement.super_IfcElement.
    super_IfcProduct.super_IfcObject.field_0x88 = 0x77c5a0;
  (this->super_IfcDistributionFlowElement).super_IfcDistributionElement.super_IfcElement.
  super_IfcProduct.super_IfcObject.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.
  _vptr_ObjectHelper = (_func_int **)0x77c5c8;
  *(undefined8 *)
   &(this->super_IfcDistributionFlowElement).super_IfcDistributionElement.super_IfcElement.
    super_IfcProduct.super_IfcObject.field_0xd0 = 0x77c5f0;
  *(undefined8 *)
   &(this->super_IfcDistributionFlowElement).super_IfcDistributionElement.super_IfcElement.
    super_IfcProduct.field_0x100 = 0x77c618;
  *(undefined8 *)
   &(this->super_IfcDistributionFlowElement).super_IfcDistributionElement.super_IfcElement.
    field_0x138 = 0x77c640;
  *(undefined8 *)
   &(this->super_IfcDistributionFlowElement).super_IfcDistributionElement.super_IfcElement.
    field_0x148 = 0x77c668;
  *(undefined8 *)&(this->super_IfcDistributionFlowElement).super_IfcDistributionElement.field_0x158
       = 0x77c690;
  return;
}

Assistant:

IfcFlowStorageDevice() : Object("IfcFlowStorageDevice") {}